

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcMux.c
# Opt level: O3

Lpk_Res_t * Lpk_MuxAnalize(Lpk_Man_t *pMan,Lpk_Fun_t *p)

{
  char *pDelays;
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Lpk_Res_t *pLVar8;
  byte bVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  uint uVar18;
  uint uVar20;
  undefined1 auVar19 [16];
  
  Lpk_MuxAnalize::Res.nSuppSizeS = 0;
  Lpk_MuxAnalize::Res.nSuppSizeL = 0;
  Lpk_MuxAnalize::Res.DelayEst = 0;
  Lpk_MuxAnalize::Res.AreaEst = 0;
  Lpk_MuxAnalize::Res.nBSVars = 0;
  Lpk_MuxAnalize::Res.BSVars = 0;
  Lpk_MuxAnalize::Res.nCofVars = 0;
  Lpk_MuxAnalize::Res.pCofVars[0] = '\0';
  Lpk_MuxAnalize::Res.pCofVars[1] = '\0';
  Lpk_MuxAnalize::Res.pCofVars[2] = '\0';
  Lpk_MuxAnalize::Res.pCofVars[3] = '\0';
  Lpk_MuxAnalize::Res.Variable = 0;
  Lpk_MuxAnalize::Res.Polarity = 0;
  if ((-1 << ((byte)(*(uint *)&p->field_0x8 >> 7) & 0x1f) ^ p->uSupp) != 0xffffffff) {
    __assert_fail("p->uSupp == Kit_BitMask(p->nVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcMux.c"
                  ,0x33,"Lpk_Res_t *Lpk_MuxAnalize(Lpk_Man_t *, Lpk_Fun_t *)");
  }
  if ((*(uint *)&p->field_0x8 >> 0x1e & 1) == 0) {
    __assert_fail("p->fSupports",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcMux.c"
                  ,0x34,"Lpk_Res_t *Lpk_MuxAnalize(Lpk_Man_t *, Lpk_Fun_t *)");
  }
  Lpk_MuxAnalize::Res.Variable = -1;
  Lpk_MuxAnalize::Res.Polarity = 0;
  pDelays = p->pDelays;
  lVar15 = 0;
  do {
    uVar13 = 1 << ((byte)lVar15 & 0x1f);
    if ((p->uSupp >> ((uint)lVar15 & 0x1f) & 1) != 0) {
      uVar1 = p->puSupps[lVar15 * 2];
      uVar2 = (p->puSupps + lVar15 * 2)[1];
      uVar18 = (uVar1 >> 1 & 0x55555555) + (uVar1 & 0x55555555);
      uVar20 = (uVar2 >> 1 & 0x55555555) + (uVar2 & 0x55555555);
      uVar20 = (uVar20 >> 2 & 0x33333333) + (uVar20 & 0x33333333);
      uVar18 = (uVar18 >> 2 & 0x33333333) + (uVar18 & 0x33333333);
      uVar20 = (uVar20 >> 4 & 0x7070707) + (uVar20 & 0x7070707);
      uVar18 = (uVar18 >> 4 & 0x7070707) + (uVar18 & 0x7070707);
      uVar20 = (uVar20 >> 8 & 0xf000f) + (uVar20 & 0xf000f);
      uVar18 = (uVar18 >> 8 & 0xf000f) + (uVar18 & 0xf000f);
      uVar16 = (uVar20 >> 0x10) + (uVar20 & 0x1f);
      uVar18 = (uVar18 >> 0x10) + (uVar18 & 0x1f);
      uVar20 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
      if (uVar20 <= uVar18) {
        __assert_fail("nSuppSize0 < (int)p->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcMux.c"
                      ,0x3b,"Lpk_Res_t *Lpk_MuxAnalize(Lpk_Man_t *, Lpk_Fun_t *)");
      }
      cVar12 = (char)uVar16;
      if (uVar20 <= uVar16) {
        __assert_fail("nSuppSize1 < (int)p->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcMux.c"
                      ,0x3c,"Lpk_Res_t *Lpk_MuxAnalize(Lpk_Man_t *, Lpk_Fun_t *)");
      }
      auVar19._0_4_ = -(uint)(uVar16 == 0);
      auVar19._4_4_ = -(uint)(uVar16 == 0);
      auVar19._8_4_ = -(uint)(uVar18 == 0);
      auVar19._12_4_ = -(uint)(uVar18 == 0);
      iVar4 = movmskpd(uVar20,auVar19);
      if (iVar4 == 0) {
        uVar14 = *(uint *)&p->field_0x8 >> 0xc & 0xf;
        iVar4 = uVar14 - 2;
        auVar17._0_4_ = -(uint)(iVar4 < (int)uVar16);
        auVar17._4_4_ = -(uint)(iVar4 < (int)uVar16);
        auVar17._8_4_ = -(uint)(iVar4 < (int)uVar18);
        auVar17._12_4_ = -(uint)(iVar4 < (int)uVar18);
        uVar20 = movmskpd(iVar4,auVar17);
        bVar9 = (byte)uVar20;
        if (((bVar9 >> 1 | bVar9) & 1) == 0) {
          iVar5 = Lpk_SuppDelay(uVar1 | uVar13,pDelays);
          iVar7 = Lpk_SuppDelay(p->puSupps[lVar15 * 2 + 1],pDelays);
          iVar4 = iVar7 + 1;
          if (iVar7 + 1 < iVar5) {
            iVar4 = iVar5;
          }
          iVar7 = Lpk_SuppDelay(uVar13 | p->puSupps[lVar15 * 2 + 1],pDelays);
          iVar6 = Lpk_SuppDelay(p->puSupps[lVar15 * 2],pDelays);
          iVar5 = iVar6 + 1;
          if (iVar6 + 1 < iVar7) {
            iVar5 = iVar7;
          }
          iVar7 = iVar5;
          if (iVar4 < iVar5) {
            iVar7 = iVar4;
          }
          bVar3 = iVar5 <= iVar4;
          uVar13 = *(uint *)&p->field_0x8;
          iVar4 = 2;
        }
        else if (bVar9 >> 1 == 0) {
          iVar4 = Lpk_SuppDelay(uVar1 | uVar13,pDelays);
          iVar5 = Lpk_SuppDelay(p->puSupps[lVar15 * 2 + 1],pDelays);
          iVar7 = iVar5 + 1;
          if (iVar5 + 1 < iVar4) {
            iVar7 = iVar4;
          }
          uVar13 = *(uint *)&p->field_0x8;
          cVar10 = ((byte)(uVar13 >> 0xc) & 0xf) - 1;
          iVar4 = ((int)((char)(cVar12 + -1) / cVar10) -
                  (uint)((char)(cVar12 + -1) % cVar10 == '\0')) + 2;
          bVar3 = false;
        }
        else {
          cVar10 = (char)uVar18;
          if ((uVar20 & 1) == 0) {
            iVar4 = Lpk_SuppDelay(uVar2 | uVar13,pDelays);
            iVar5 = Lpk_SuppDelay(p->puSupps[lVar15 * 2],pDelays);
            iVar7 = iVar5 + 1;
            if (iVar5 + 1 < iVar4) {
              iVar7 = iVar4;
            }
            uVar13 = *(uint *)&p->field_0x8;
            cVar12 = ((byte)(uVar13 >> 0xc) & 0xf) - 1;
            iVar4 = ((int)((char)(cVar10 + -1) / cVar12) -
                    (uint)((char)(cVar10 + -1) % cVar12 == '\0')) + 2;
            bVar3 = true;
          }
          else if (uVar14 < uVar18) {
            iVar4 = Lpk_SuppDelay(uVar1 | uVar13,pDelays);
            iVar5 = Lpk_SuppDelay(p->puSupps[lVar15 * 2 + 1],pDelays);
            iVar7 = iVar5 + 1;
            if (iVar5 + 1 < iVar4) {
              iVar7 = iVar4;
            }
            if (uVar14 < uVar16) {
              iVar4 = Lpk_SuppDelay(uVar13 | p->puSupps[lVar15 * 2 + 1],pDelays);
              iVar6 = Lpk_SuppDelay(p->puSupps[lVar15 * 2],pDelays);
              iVar5 = iVar6 + 1;
              if (iVar6 + 1 < iVar4) {
                iVar5 = iVar4;
              }
              uVar13 = *(uint *)&p->field_0x8;
              cVar11 = ((byte)(uVar13 >> 0xc) & 0xf) - 1;
              iVar6 = iVar5;
              if (iVar7 < iVar5) {
                iVar6 = iVar7;
              }
              uVar1 = uVar16;
              if (iVar5 < iVar7) {
                uVar1 = uVar18;
                cVar10 = cVar12;
              }
              cVar12 = (char)uVar1 + -1;
              iVar4 = (((int)((char)(cVar10 + '\x01') / cVar11) -
                       (uint)((char)(cVar10 + '\x01') % cVar11 == '\0')) + (int)(cVar12 / cVar11) +
                      2) - (uint)(cVar12 % cVar11 == '\0');
              bVar3 = iVar5 <= iVar7;
              iVar7 = iVar6;
            }
            else {
              uVar13 = *(uint *)&p->field_0x8;
              cVar12 = ((byte)(uVar13 >> 0xc) & 0xf) - 1;
              iVar4 = ((int)((char)(cVar10 + '\x01') / cVar12) -
                      (uint)((char)(cVar10 + '\x01') % cVar12 == '\0')) + 2;
              bVar3 = false;
            }
          }
          else {
            iVar4 = Lpk_SuppDelay(uVar2 | uVar13,pDelays);
            iVar5 = Lpk_SuppDelay(p->puSupps[lVar15 * 2],pDelays);
            iVar7 = iVar5 + 1;
            if (iVar5 + 1 < iVar4) {
              iVar7 = iVar4;
            }
            uVar13 = *(uint *)&p->field_0x8;
            cVar10 = ((byte)(uVar13 >> 0xc) & 0xf) - 1;
            iVar4 = ((int)((char)(cVar12 + '\x01') / cVar10) -
                    (uint)((char)(cVar12 + '\x01') % cVar10 == '\0')) + 2;
            bVar3 = true;
          }
        }
        if ((iVar7 <= (int)(uVar13 >> 0x15 & 0x1ff)) && (iVar4 <= (int)(uVar13 >> 0x10 & 0x1f))) {
          uVar18 = uVar18 + (uint)(bVar3 ^ 1) * 2;
          uVar16 = uVar16 + (uint)bVar3 * 2;
          uVar1 = uVar16;
          if (uVar18 < uVar16) {
            uVar1 = uVar18;
          }
          uVar2 = uVar16;
          if (uVar16 < uVar18) {
            uVar2 = uVar18;
          }
          if (uVar2 <= (uVar13 >> 7 & 0x1f)) {
            if (Lpk_MuxAnalize::Res.Variable != -1) {
              if (Lpk_MuxAnalize::Res.AreaEst <= iVar4) {
                if (Lpk_MuxAnalize::Res.AreaEst == iVar4) {
                  if (((int)(uVar18 + uVar16) <
                       Lpk_MuxAnalize::Res.nSuppSizeL + Lpk_MuxAnalize::Res.nSuppSizeS) ||
                     ((Lpk_MuxAnalize::Res.nSuppSizeL + Lpk_MuxAnalize::Res.nSuppSizeS ==
                       uVar18 + uVar16 && (iVar7 < Lpk_MuxAnalize::Res.DelayEst))))
                  goto LAB_00472395;
                }
                goto LAB_004723bb;
              }
            }
LAB_00472395:
            Lpk_MuxAnalize::Res.Polarity._0_1_ = bVar3;
            Lpk_MuxAnalize::Res.Variable = (uint)lVar15;
            Lpk_MuxAnalize::Res.Polarity._1_3_ = 0;
            Lpk_MuxAnalize::Res.DelayEst = iVar7;
            Lpk_MuxAnalize::Res.AreaEst = iVar4;
            Lpk_MuxAnalize::Res.nSuppSizeL = uVar2;
            Lpk_MuxAnalize::Res.nSuppSizeS = uVar1;
          }
        }
      }
    }
LAB_004723bb:
    lVar15 = lVar15 + 1;
    if (lVar15 == 0x10) {
      pLVar8 = (Lpk_Res_t *)0x0;
      if (Lpk_MuxAnalize::Res.Variable != -1) {
        pLVar8 = &Lpk_MuxAnalize::Res;
      }
      return pLVar8;
    }
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Checks the possibility of MUX decomposition.]

  Description [Returns the best variable to use for MUX decomposition.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Lpk_Res_t * Lpk_MuxAnalize( Lpk_Man_t * pMan, Lpk_Fun_t * p )
{
    static Lpk_Res_t Res, * pRes = &Res;
    int nSuppSize0, nSuppSize1, nSuppSizeS, nSuppSizeL;
    int Var, Area, Polarity, Delay, Delay0, Delay1, DelayA, DelayB;
    memset( pRes, 0, sizeof(Lpk_Res_t) );
    assert( p->uSupp == Kit_BitMask(p->nVars) );
    assert( p->fSupports );
    // derive the delay and area after MUX-decomp with each var - and find the best var
    pRes->Variable = -1;
    Lpk_SuppForEachVar( p->uSupp, Var )
    {
        nSuppSize0 = Kit_WordCountOnes(p->puSupps[2*Var+0]);
        nSuppSize1 = Kit_WordCountOnes(p->puSupps[2*Var+1]);
        assert( nSuppSize0 < (int)p->nVars );
        assert( nSuppSize1 < (int)p->nVars );
        if ( nSuppSize0 < 1 || nSuppSize1 < 1 )
            continue;
//printf( "%d %d    ", nSuppSize0, nSuppSize1 );
        if ( nSuppSize0 <= (int)p->nLutK - 2 && nSuppSize1 <= (int)p->nLutK - 2 )
        {
            // include cof var into 0-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay0 = Abc_MaxInt( DelayA, DelayB + 1 );
            // include cof var into 1-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay1 = Abc_MaxInt( DelayA, DelayB + 1 );
            // get the best delay
            Delay = Abc_MinInt( Delay0, Delay1 );
            Area = 2;
            Polarity = (int)(Delay == Delay1);
        }
        else if ( nSuppSize0 <= (int)p->nLutK - 2 )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize1, p->nLutK );
            Polarity = 0;
        }
        else if ( nSuppSize1 <= (int)p->nLutK - 2 )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize0, p->nLutK );
            Polarity = 1;
        }
        else if ( nSuppSize0 <= (int)p->nLutK )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize1+2, p->nLutK );
            Polarity = 1;
        }
        else if ( nSuppSize1 <= (int)p->nLutK )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize0+2, p->nLutK );
            Polarity = 0;
        }
        else
        {
            // include cof var into 0-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay0 = Abc_MaxInt( DelayA, DelayB + 1 );
            // include cof var into 1-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay1 = Abc_MaxInt( DelayA, DelayB + 1 );
            // get the best delay
            Delay = Abc_MinInt( Delay0, Delay1 );
            if ( Delay == Delay0 )
                Area = Lpk_LutNumLuts( nSuppSize0+2, p->nLutK ) + Lpk_LutNumLuts( nSuppSize1, p->nLutK );
            else
                Area = Lpk_LutNumLuts( nSuppSize1+2, p->nLutK ) + Lpk_LutNumLuts( nSuppSize0, p->nLutK );
            Polarity = (int)(Delay == Delay1);
        }
        // find the best variable
        if ( Delay > (int)p->nDelayLim )
            continue;
        if ( Area > (int)p->nAreaLim )
            continue;
        nSuppSizeS = Abc_MinInt( nSuppSize0 + 2 *!Polarity, nSuppSize1 + 2 * Polarity );
        nSuppSizeL = Abc_MaxInt( nSuppSize0 + 2 *!Polarity, nSuppSize1 + 2 * Polarity );
        if ( nSuppSizeL > (int)p->nVars )
            continue;
        if ( pRes->Variable == -1 || pRes->AreaEst > Area || 
            (pRes->AreaEst == Area && pRes->nSuppSizeS + pRes->nSuppSizeL > nSuppSizeS + nSuppSizeL) || 
            (pRes->AreaEst == Area && pRes->nSuppSizeS + pRes->nSuppSizeL == nSuppSizeS + nSuppSizeL && pRes->DelayEst > Delay) )
        {
            pRes->Variable = Var;
            pRes->Polarity = Polarity;
            pRes->AreaEst  = Area;
            pRes->DelayEst = Delay;
            pRes->nSuppSizeS = nSuppSizeS;
            pRes->nSuppSizeL = nSuppSizeL;
        }
    }
    return pRes->Variable == -1 ? NULL : pRes;
}